

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basevectors.h
# Opt level: O2

VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
* __thiscall
soplex::
VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
::
multAdd<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
          (VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
           *this,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *x,
          SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *vec)

{
  long lVar1;
  ulong uVar2;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  cpp_dec_float<50U,_int,_void> local_68;
  
  uVar2 = (ulong)(uint)vec->memused;
  lVar1 = uVar2 * 0x3c;
  while( true ) {
    if ((int)uVar2 < 1) break;
    local_68.fpclass = cpp_dec_float_finite;
    local_68.prec_elem = 10;
    local_68.data._M_elems[0] = 0;
    local_68.data._M_elems[1] = 0;
    local_68.data._M_elems[2] = 0;
    local_68.data._M_elems[3] = 0;
    local_68.data._M_elems[4] = 0;
    local_68.data._M_elems[5] = 0;
    local_68.data._M_elems._24_5_ = 0;
    local_68.data._M_elems[7]._1_3_ = 0;
    local_68.data._M_elems._32_5_ = 0;
    local_68._37_8_ = 0;
    boost::multiprecision::default_ops::
    eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
              (&local_68,&x->m_backend,
               (cpp_dec_float<50U,_int,_void> *)
               ((long)vec->m_elem[-1].val.m_backend.data._M_elems + lVar1));
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
              ((cpp_dec_float<50U,_int,_void> *)
               ((long)*(int *)((long)(&vec->m_elem[-1].val + 1) + lVar1) * 0x38 + *(long *)this),
               &local_68);
    uVar2 = (ulong)((int)uVar2 - 1);
    lVar1 = lVar1 + -0x3c;
  }
  return (VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *)this;
}

Assistant:

inline
VectorBase<R>& VectorBase<R>::multAdd(const S& x, const SVectorBase<T>& vec)
{
   for(int i = vec.size() - 1; i >= 0; --i)
   {
      assert(vec.index(i) < dim());
      val[vec.index(i)] += x * vec.value(i);
   }

   return *this;
}